

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StopFreezeReliablePdu.cpp
# Opt level: O0

bool __thiscall
DIS::StopFreezeReliablePdu::operator==(StopFreezeReliablePdu *this,StopFreezeReliablePdu *rhs)

{
  bool bVar1;
  bool local_19;
  bool ivarsEqual;
  StopFreezeReliablePdu *rhs_local;
  StopFreezeReliablePdu *this_local;
  
  local_19 = SimulationManagementWithReliabilityFamilyPdu::operator==
                       (&this->super_SimulationManagementWithReliabilityFamilyPdu,
                        &rhs->super_SimulationManagementWithReliabilityFamilyPdu);
  bVar1 = ClockTime::operator==(&this->_realWorldTime,&rhs->_realWorldTime);
  if (!bVar1) {
    local_19 = false;
  }
  if (this->_reason != rhs->_reason) {
    local_19 = false;
  }
  if (this->_frozenBehavior != rhs->_frozenBehavior) {
    local_19 = false;
  }
  if (this->_requiredReliablityService != rhs->_requiredReliablityService) {
    local_19 = false;
  }
  if (this->_pad1 != rhs->_pad1) {
    local_19 = false;
  }
  if (this->_requestID != rhs->_requestID) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool StopFreezeReliablePdu::operator ==(const StopFreezeReliablePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = SimulationManagementWithReliabilityFamilyPdu::operator==(rhs);

     if( ! (_realWorldTime == rhs._realWorldTime) ) ivarsEqual = false;
     if( ! (_reason == rhs._reason) ) ivarsEqual = false;
     if( ! (_frozenBehavior == rhs._frozenBehavior) ) ivarsEqual = false;
     if( ! (_requiredReliablityService == rhs._requiredReliablityService) ) ivarsEqual = false;
     if( ! (_pad1 == rhs._pad1) ) ivarsEqual = false;
     if( ! (_requestID == rhs._requestID) ) ivarsEqual = false;

    return ivarsEqual;
 }